

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afl_check.c
# Opt level: O0

int main(int argc,char **argv)

{
  size_t len_00;
  nbt_node *tree;
  size_t len;
  char buf [65536];
  FILE *local_20;
  FILE *in;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_20 = _stdin;
  if ((argc < 2) || (local_20 = fopen(argv[1],"rb"), local_20 != (FILE *)0x0)) {
    len_00 = fread(&len,1,0x10000,local_20);
    tree = nbt_parse(&len,len_00);
    nbt_free(tree);
  }
  else {
    perror("fopen");
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[]) {
    FILE *in = stdin;
    if (argc > 1) {
        in = fopen(argv[1], "rb");
        if (!in) {
            perror("fopen");
            return -1;
        }
    }

#ifdef __AFL_HAVE_MANUAL_CONTROL
  __AFL_INIT();
#endif


#ifdef __AFL_HAVE_MANUAL_CONTROL
    while (__AFL_LOOP(10000)) {
#endif
        char buf[65536];
        size_t len = fread(buf, 1, sizeof(buf), in);
        nbt_free(nbt_parse(buf, len));
#ifdef __AFL_HAVE_MANUAL_CONTROL
    }
#endif
}